

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O2

token * dmrC_tokenize_buffer(dmr_C *C,uchar *buffer,unsigned_long size,token **endtoken)

{
  token *ptVar1;
  token *ptVar2;
  undefined1 local_60 [8];
  stream_t stream;
  
  ptVar1 = setup_stream(C,(stream_t *)local_60,0,-1,buffer,(uint)size);
  ptVar2 = tokenize_stream(C,(stream_t *)local_60);
  *endtoken = ptVar2;
  return ptVar1;
}

Assistant:

struct token *dmrC_tokenize_buffer(struct dmr_C *C, unsigned char *buffer,
			      unsigned long size, struct token **endtoken)
{
	stream_t stream;
	struct token *begin;

	begin = setup_stream(C, &stream, 0, -1, buffer, size);
	*endtoken = tokenize_stream(C, &stream);
	return begin;
}